

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool util::compareString(char *str1,char *str2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int i;
  bool bVar5;
  
  sVar3 = strlen(str1);
  sVar4 = strlen(str2);
  if (sVar3 == sVar4) {
    sVar4 = 0;
    do {
      bVar5 = sVar3 == sVar4;
      if (bVar5) {
        return bVar5;
      }
      iVar1 = tolower((int)str1[sVar4]);
      iVar2 = tolower((int)str2[sVar4]);
      sVar4 = sVar4 + 1;
    } while (iVar1 == iVar2);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool util::compareString(const char* str1, const char* str2){
    if(strlen(str1) != strlen(str2))
        return false;
    for(int i = 0; i < strlen(str1); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}